

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  bool bVar1;
  int iVar2;
  handle local_70;
  obj_attr_accessor local_68;
  handle local_48;
  PyObject *local_40;
  char *local_38;
  handle local_30;
  
  cpp_function::name((cpp_function *)&local_48);
  object_api<pybind11::handle>::attr
            (&local_68,(object_api<pybind11::handle> *)cls,(object *)&local_48);
  accessor_policies::obj_attr::set
            (local_68.obj,local_68.key.super_handle,
             (cf->super_function).super_object.super_handle.m_ptr);
  handle::dec_ref(&local_68.cache.super_handle);
  handle::dec_ref(&local_68.key.super_handle);
  handle::dec_ref(&local_48);
  iVar2 = strcmp(name_,"__eq__");
  if (iVar2 == 0) {
    local_68.obj.m_ptr = (cls->super_handle).m_ptr;
    local_68.key.super_handle.m_ptr = (handle)(PyObject *)0x14b9de;
    local_68.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>
                      ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                        *)&local_68,(char (*) [9])"__hash__");
    bVar1 = !bVar1;
    handle::dec_ref(&local_68.cache.super_handle);
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    handle::inc_ref(&local_70);
    local_40 = (cls->super_handle).m_ptr;
    local_38 = "__hash__";
    local_30.m_ptr = (PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_40,"__hash__",local_70);
    handle::dec_ref(&local_30);
    handle::dec_ref(&local_70);
  }
  return;
}

Assistant:

inline void add_class_method(object &cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (std::strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
        cls.attr("__hash__") = none();
    }
}